

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_functions_to_test.hpp
# Opt level: O1

void duckdb::udf_max_flat<double>(DataChunk *args,ExpressionState *state,Vector *result)

{
  double *pdVar1;
  double dVar2;
  void *__s;
  long lVar3;
  long lVar4;
  reference pvVar5;
  long lVar6;
  size_type __n;
  
  duckdb::DataChunk::Flatten();
  duckdb::Vector::SetVectorType((VectorType)result);
  __s = *(void **)(result + 0x20);
  memset(__s,0,*(long *)(args + 0x18) << 3);
  if (*(long *)(args + 8) != *(long *)args) {
    __n = 0;
    do {
      pvVar5 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,__n);
      lVar3 = *(long *)(args + 0x18);
      if (lVar3 != 0) {
        lVar4 = *(long *)(pvVar5 + 0x20);
        lVar6 = 0;
        do {
          dVar2 = *(double *)(lVar4 + lVar6 * 8);
          pdVar1 = (double *)((long)__s + lVar6 * 8);
          if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
            *(double *)((long)__s + lVar6 * 8) = dVar2;
          }
          lVar6 = lVar6 + 1;
        } while (lVar3 != lVar6);
      }
      __n = __n + 1;
    } while (__n < (ulong)((*(long *)(args + 8) - *(long *)args >> 3) * 0x4ec4ec4ec4ec4ec5));
  }
  return;
}

Assistant:

static void udf_max_flat(DataChunk &args, ExpressionState &state, Vector &result) {
	args.Flatten();
	D_ASSERT(TypeIsNumeric(GetTypeId<TYPE>()));

	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto result_data = FlatVector::GetData<TYPE>(result);

	// Initialize the result vector with the minimum value from TYPE.
	memset(result_data, std::numeric_limits<TYPE>::min(), args.size() * sizeof(TYPE));

	for (idx_t col_idx = 0; col_idx < args.ColumnCount(); col_idx++) {
		auto &input = args.data[col_idx];
		D_ASSERT((GetTypeId<TYPE>()) == input.GetType().InternalType());
		auto input_data = FlatVector::GetData<TYPE>(input);
		for (idx_t i = 0; i < args.size(); ++i) {
			if (result_data[i] < input_data[i]) {
				result_data[i] = input_data[i];
			}
		}
	}
}